

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_chunk.h
# Opt level: O0

vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
* __thiscall
google::protobuf::compiler::cpp::
CollectFields<google::protobuf::compiler::cpp::(anonymous_namespace)::FindNextTest_AllUnequal_Test::TestBody()::__0>
          (vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
           *__return_storage_ptr__,cpp *this,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields,Options *options,anon_class_1_0_00000001 *equivalent)

{
  bool bVar1;
  reference ppFVar2;
  reference pvVar3;
  reference ppFVar4;
  bool local_5f;
  bool local_5e;
  bool local_5d [13];
  FieldDescriptor *local_50;
  FieldDescriptor *field;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  anon_class_1_0_00000001 *equivalent_local;
  Options *options_local;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  *chunks;
  
  std::
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ::vector(__return_storage_ptr__);
  __end3 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)this);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)this);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                *)&field);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    ppFVar2 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end3);
    local_50 = *ppFVar2;
    bVar1 = std::
            vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
            ::empty(__return_storage_ptr__);
    if (bVar1) {
LAB_00eb878f:
      local_5d[0] = protobuf::internal::cpp::HasHasbit(local_50);
      local_5e = IsRarelyPresent(local_50,(Options *)fields);
      local_5f = ShouldSplit(local_50,(Options *)fields);
      std::
      vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>
      ::emplace_back<bool,bool,bool>
                ((vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>
                  *)__return_storage_ptr__,local_5d,&local_5e,&local_5f);
    }
    else {
      pvVar3 = std::
               vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
               ::back(__return_storage_ptr__);
      ppFVar4 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::back(&pvVar3->fields);
      bVar1 = anon_unknown_0::FindNextTest_AllUnequal_Test::TestBody::anon_class_1_0_00000001::
              operator()((anon_class_1_0_00000001 *)options,*ppFVar4,local_50);
      if (!bVar1) goto LAB_00eb878f;
    }
    pvVar3 = std::
             vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
             ::back(__return_storage_ptr__);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back(&pvVar3->fields,&local_50);
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end3);
  } while( true );
}

Assistant:

std::vector<FieldChunk> CollectFields(
    const std::vector<const FieldDescriptor*>& fields, const Options& options,
    const Predicate& equivalent) {
  std::vector<FieldChunk> chunks;
  for (auto field : fields) {
    if (chunks.empty() || !equivalent(chunks.back().fields.back(), field)) {
      chunks.emplace_back(internal::cpp::HasHasbit(field),
                          IsRarelyPresent(field, options),
                          ShouldSplit(field, options));
    }
    chunks.back().fields.push_back(field);
  }
  return chunks;
}